

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>,_ProString>
                  *this)

{
  ProString::~ProString((ProString *)0x2b4893);
  QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>::
  ~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<ProString,_ProString>,_ProString>,_char>
                   *)0x2b489d);
  return;
}

Assistant:

~QStringBuilder() = default;